

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v7::detail::fill<char*,char>(char *it,size_t n,fill_t<char> *fill)

{
  char *__result;
  fill_t<char> *in_RDX;
  char *in_RSI;
  char *in_RDI;
  size_t i;
  size_t fill_size;
  char *in_stack_ffffffffffffffd0;
  char *pcVar1;
  char *local_10;
  char *local_8;
  
  __result = (char *)fill_t<char>::size(in_RDX);
  if (__result == (char *)0x1) {
    fill_t<char>::operator[](in_RDX,0);
    local_8 = std::fill_n<char*,unsigned_long,char>
                        (in_RDX->data_,(unsigned_long)__result,in_stack_ffffffffffffffd0);
  }
  else {
    local_10 = in_RDI;
    for (pcVar1 = (char *)0x0; pcVar1 < in_RSI; pcVar1 = pcVar1 + 1) {
      fill_t<char>::data(in_RDX);
      local_10 = std::copy_n<char_const*,unsigned_long,char*>(in_RSI,(unsigned_long)in_RDX,__result)
      ;
    }
    local_8 = local_10;
  }
  return local_8;
}

Assistant:

FMT_NOINLINE OutputIt fill(OutputIt it, size_t n, const fill_t<Char>& fill) {
  auto fill_size = fill.size();
  if (fill_size == 1) return std::fill_n(it, n, fill[0]);
  for (size_t i = 0; i < n; ++i) it = std::copy_n(fill.data(), fill_size, it);
  return it;
}